

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O1

void __thiscall
HighsDomain::ObjectivePropagation::recomputeCapacityThreshold(ObjectivePropagation *this)

{
  double dVar1;
  int iVar2;
  HighsDomain *pHVar3;
  HighsObjectiveFunction *pHVar4;
  pointer piVar5;
  HighsMipSolver *pHVar6;
  pointer ppVar7;
  pointer pOVar8;
  pointer piVar9;
  pointer pdVar10;
  pointer pHVar11;
  ulong uVar12;
  pointer pdVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  bool bVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  
  pHVar3 = this->domain;
  pHVar4 = this->objFunc;
  piVar5 = (pHVar4->cliquePartitionStart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar14 = (int)((ulong)((long)(pHVar4->cliquePartitionStart).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)piVar5) >> 2) - 1;
  pHVar6 = pHVar3->mipsolver;
  dVar1 = ((pHVar6->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
  this->capacityThreshold = -dVar1;
  if (0 < (int)uVar14) {
    dVar20 = this->capacityThreshold;
    ppVar7 = (this->contributionPartitionSets).
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    pOVar8 = (this->objectiveLowerContributions).
             super__Vector_base<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar12 = 0;
    do {
      iVar2 = ppVar7[uVar12].second;
      lVar18 = (long)iVar2;
      if (lVar18 != -1) {
        pdVar13 = (pHVar3->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        dVar21 = (pHVar3->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[pOVar8[lVar18].col];
        if ((dVar21 != pdVar13[pOVar8[lVar18].col]) ||
           (NAN(dVar21) || NAN(pdVar13[pOVar8[lVar18].col]))) {
          uVar16 = ppVar7[uVar12].first;
          if (uVar16 == 0xffffffff) {
            iVar15 = -1;
          }
          else {
            do {
              uVar17 = pOVar8[(int)uVar16].links.child[1];
              bVar19 = uVar17 != 0xffffffff;
              if (!bVar19) {
                uVar17 = uVar16;
              }
              pdVar13 = (pointer)((ulong)pdVar13 & 0xffffffff);
              if (!bVar19) {
                pdVar13 = (pointer)(ulong)uVar16;
              }
              iVar15 = (int)pdVar13;
              uVar16 = uVar17;
            } while (bVar19);
          }
          dVar21 = pOVar8[lVar18].contribution;
          if (iVar15 != iVar2) {
            dVar21 = dVar21 - pOVar8[iVar15].contribution;
          }
          dVar21 = dVar21 * (1.0 - dVar1);
          if (dVar21 <= dVar20) {
            dVar21 = dVar20;
          }
          dVar20 = dVar21;
          this->capacityThreshold = dVar20;
        }
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar14);
  }
  piVar9 = (pHVar4->objectiveNonzeros).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = piVar5[(int)uVar14];
  lVar18 = (long)iVar2;
  iVar15 = (int)((ulong)((long)(pHVar4->objectiveNonzeros).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)piVar9) >> 2);
  if (iVar2 < iVar15) {
    dVar20 = this->capacityThreshold;
    pdVar13 = (pHVar3->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar10 = (pHVar3->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pHVar11 = (pHVar6->model_->integrality_).
              super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      iVar2 = piVar9[lVar18];
      dVar22 = pdVar10[iVar2] - pdVar13[iVar2];
      dVar21 = dVar1;
      if ((pHVar11[iVar2] == kContinuous) &&
         (dVar23 = dVar22 * 0.3, dVar21 = dVar1 * 1000.0, dVar1 * 1000.0 <= dVar23)) {
        dVar21 = dVar23;
      }
      dVar21 = (dVar22 - dVar21) * ABS(this->cost[iVar2]);
      if (dVar21 <= dVar20) {
        dVar21 = dVar20;
      }
      dVar20 = dVar21;
      this->capacityThreshold = dVar20;
      lVar18 = lVar18 + 1;
    } while (iVar15 != lVar18);
  }
  return;
}

Assistant:

void HighsDomain::ObjectivePropagation::recomputeCapacityThreshold() {
  const auto& partitionStarts = objFunc->getCliquePartitionStarts();
  HighsInt numPartitions = objFunc->getNumCliquePartitions();

  capacityThreshold = -domain->feastol();
  for (HighsInt i = 0; i < numPartitions; ++i) {
    ObjectiveContributionTree contributionTree(this, i);
    HighsInt worstPos = contributionTree.first();
    if (worstPos == -1) continue;
    if (domain->isFixed(objectiveLowerContributions[worstPos].col)) continue;

    double contribution = objectiveLowerContributions[worstPos].contribution;
    HighsInt bestPos = contributionTree.last();
    if (bestPos != worstPos)
      contribution -= objectiveLowerContributions[bestPos].contribution;

    capacityThreshold =
        std::max(capacityThreshold, contribution * (1.0 - domain->feastol()));
  }

  const auto& objNonzeros = objFunc->getObjectiveNonzeros();
  const HighsInt numObjNzs = objNonzeros.size();
  for (HighsInt i = partitionStarts[numPartitions]; i < numObjNzs; ++i) {
    HighsInt col = objNonzeros[i];

    capacityThreshold = std::max(
        capacityThreshold,
        std::fabs(cost[col]) *
            boundRange(domain->col_upper_[col], domain->col_lower_[col],
                       domain->feastol(), domain->variableType(col)));
  }
}